

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

bool __thiscall flow::lang::Parser::importDecl(Parser *this,UnitSym *unit)

{
  size_type sVar1;
  bool bVar2;
  vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *__range3;
  _Alloc_hider _Var3;
  _List_node_base *p_Var4;
  string base;
  string path;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  nextToken(this);
  names.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&names;
  names.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  names.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       names.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  bVar2 = importOne(this,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)names.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next);
  if (bVar2) {
    do {
      if (((this->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_ != Comma) {
        path._M_dataplus._M_p = (pointer)&path.field_2;
        path._M_string_length = 0;
        path.field_2._M_local_buf[0] = '\0';
        bVar2 = consumeIf(this,From);
        if (bVar2) {
          stringValue_abi_cxx11_(&base,this);
          std::__cxx11::string::operator=((string *)&path,(string *)&base);
          std::__cxx11::string::~string((string *)&base);
          bVar2 = consumeOne<flow::lang::Token,flow::lang::Token>(this,String,RawString);
          if (!bVar2) {
            consumeUntil(this,Semicolon);
            goto LAB_0011ebf3;
          }
          if ((path._M_string_length != 0) && (*path._M_dataplus._M_p != '/')) {
            std::__cxx11::string::string
                      ((string *)&base,
                       (string *)
                       &((this->lexer_)._M_t.
                         super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                         .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_
                      );
            std::__cxx11::string::rfind((char)&base,0x2f);
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&base);
            std::__cxx11::string::operator=((string *)&base,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::operator+(&local_50,&base,&path);
            std::__cxx11::string::operator=((string *)&path,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&base);
          }
        }
        p_Var4 = (_List_node_base *)&names;
        goto LAB_0011eb59;
      }
      nextToken(this);
      bVar2 = importOne(this,&names);
    } while (bVar2);
  }
  consumeUntil(this,Semicolon);
  bVar2 = false;
  goto LAB_0011ebff;
LAB_0011eb59:
  p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  if (p_Var4 == (_List_node_base *)&names) goto LAB_0011ebce;
  base.field_2._M_allocated_capacity = 0;
  base._M_dataplus._M_p = (pointer)0x0;
  base._M_string_length = 0;
  if (((this->importHandler_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar2 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_*)>
              ::operator()(&this->importHandler_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var4 + 1),&path,
                           (vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>
                            *)&base), !bVar2)) {
    std::_Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::
    ~_Vector_base((_Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *)
                  &base);
LAB_0011ebf3:
    bVar2 = false;
    goto LAB_0011ebf5;
  }
  UnitSym::import(unit,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var4 + 1),&path);
  sVar1 = base._M_string_length;
  for (_Var3 = base._M_dataplus; _Var3._M_p != (pointer)sVar1; _Var3._M_p = _Var3._M_p + 8) {
    declareBuiltin(this,*(NativeCallback **)_Var3._M_p);
  }
  std::_Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::~_Vector_base
            ((_Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *)&base)
  ;
  goto LAB_0011eb59;
LAB_0011ebce:
  bVar2 = true;
  consume(this,Semicolon);
LAB_0011ebf5:
  std::__cxx11::string::~string((string *)&path);
LAB_0011ebff:
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&names.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return bVar2;
}

Assistant:

bool Parser::importDecl(UnitSym* unit) {
  // 'import' NAME_OR_NAMELIST ['from' PATH] ';'
  nextToken();  // skip 'import'

  std::list<std::string> names;
  if (!importOne(names)) {
    consumeUntil(Token::Semicolon);
    return false;
  }

  while (token() == Token::Comma) {
    nextToken();
    if (!importOne(names)) {
      consumeUntil(Token::Semicolon);
      return false;
    }
  }

  std::string path;
  if (consumeIf(Token::From)) {
    path = stringValue();

    if (!consumeOne(Token::String, Token::RawString)) {
      consumeUntil(Token::Semicolon);
      return false;
    }

    if (!path.empty() && path[0] != '/') {
      std::string base(lexer_->location().filename);

      size_t r = base.rfind('/');
      if (r != std::string::npos) ++r;

      base = base.substr(0, r);
      path = base + path;
    }
  }

  for (const std::string& name: names) {
    std::vector<NativeCallback*> builtins;

    if (importHandler_ && !importHandler_(name, path, &builtins))
      return false;

    unit->import(name, path);

    for (NativeCallback* native : builtins) {
      declareBuiltin(native);
    }
  }

  consume(Token::Semicolon);
  return true;
}